

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricAlgorithm.cpp
# Opt level: O3

bool __thiscall
SymmetricAlgorithm::decryptInit
          (SymmetricAlgorithm *this,SymmetricKey *key,Type mode,ByteString *param_3,bool padding,
          size_t counterBits,ByteString *param_6,size_t tagBytes)

{
  if ((key != (SymmetricKey *)0x0) && (this->currentOperation == NONE)) {
    this->currentKey = key;
    this->currentCipherMode = mode;
    this->currentPaddingMode = padding;
    this->currentCounterBits = counterBits;
    this->currentTagBytes = tagBytes;
    this->currentOperation = DECRYPT;
    this->currentBufferSize = 0;
    ByteString::wipe(&this->currentAEADBuffer,0);
    return true;
  }
  return false;
}

Assistant:

bool SymmetricAlgorithm::decryptInit(const SymmetricKey* key, const SymMode::Type mode /* = SymMode::CBC */, const ByteString& /*IV = ByteString() */, bool padding /* = true */, size_t counterBits /* = 0 */, const ByteString& /*aad = ByteString()*/, size_t tagBytes /* = 0 */)
{
	if ((key == NULL) || (currentOperation != NONE))
	{
		return false;
	}

	currentKey = key;
	currentCipherMode = mode;
	currentPaddingMode = padding;
	currentCounterBits = counterBits;
	currentTagBytes = tagBytes;
	currentOperation = DECRYPT;
	currentBufferSize = 0;
	currentAEADBuffer.wipe();

	return true;
}